

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O0

void btSoftBodyHelpers::DrawFrame(btSoftBody *psb,btIDebugDraw *idraw)

{
  long *plVar1;
  int iVar2;
  long *in_RSI;
  long in_RDI;
  btVector3 *x_00;
  btVector3 bVar3;
  btVector3 x;
  int i;
  btVector3 Zaxis;
  btVector3 Yaxis;
  btVector3 Xaxis;
  btMatrix3x3 trs;
  btVector3 com;
  btVector3 *this;
  btMatrix3x3 *in_stack_fffffffffffffdb0;
  btMatrix3x3 *m;
  btScalar local_200;
  btScalar local_1fc;
  btScalar local_1f8;
  btVector3 local_1f4;
  undefined8 local_1e4;
  undefined8 local_1dc;
  undefined8 local_1d4;
  btScalar local_1cc;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  int iVar4;
  int n;
  btScalar in_stack_fffffffffffffe40;
  btScalar in_stack_fffffffffffffe44;
  btScalar local_1b8;
  btVector3 local_1b4;
  undefined8 local_1a4;
  undefined8 local_19c;
  undefined8 local_194;
  undefined8 local_18c;
  btScalar local_184;
  btScalar local_180;
  btScalar local_17c;
  btVector3 local_178;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  btScalar local_148;
  btScalar local_144;
  btScalar local_140;
  btVector3 local_13c;
  undefined8 local_12c;
  undefined8 local_124;
  undefined8 local_11c;
  undefined8 local_114;
  btScalar local_10c;
  btScalar local_108;
  btScalar local_104 [3];
  btVector3 *in_stack_ffffffffffffff08;
  undefined8 uVar5;
  btIDebugDraw *idraw_00;
  btScalar local_d0;
  btScalar local_cc;
  btScalar local_c8;
  btMatrix3x3 local_c4;
  btScalar local_94;
  btScalar local_90;
  btScalar local_8c;
  btVector3 local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_28;
  undefined8 uStack_20;
  long *local_10;
  long local_8;
  
  if ((*(byte *)(in_RDI + 0x259) & 1) != 0) {
    local_28 = *(undefined8 *)(in_RDI + 0x2a0);
    uStack_20 = *(undefined8 *)(in_RDI + 0x2a8);
    local_10 = in_RSI;
    local_8 = in_RDI;
    ::operator*((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                (btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    local_8c = 1.0;
    local_90 = 0.0;
    local_94 = 0.0;
    this = &local_88;
    btVector3::btVector3(this,&local_8c,&local_90,&local_94);
    bVar3 = ::operator*(in_stack_fffffffffffffdb0,this);
    local_70 = bVar3.m_floats._8_8_;
    local_78 = bVar3.m_floats._0_8_;
    bVar3 = btVector3::normalized(this);
    local_60 = bVar3.m_floats._8_8_;
    local_68 = bVar3.m_floats._0_8_;
    local_c8 = 0.0;
    local_cc = 1.0;
    local_d0 = 0.0;
    m = &local_c4;
    btVector3::btVector3(m->m_el,&local_c8,&local_cc,&local_d0);
    bVar3 = ::operator*(m,this);
    local_c4.m_el[1].m_floats._8_8_ = bVar3.m_floats._8_8_;
    local_c4.m_el[1].m_floats._0_8_ = bVar3.m_floats._0_8_;
    bVar3 = btVector3::normalized(this);
    local_c4.m_el[2].m_floats._8_8_ = bVar3.m_floats._8_8_;
    local_c4.m_el[2].m_floats._0_8_ = bVar3.m_floats._0_8_;
    local_104[0] = 0.0;
    local_108 = 0.0;
    local_10c = 1.0;
    btVector3::btVector3((btVector3 *)(local_104 + 1),local_104,&local_108,&local_10c);
    bVar3 = ::operator*(m,this);
    x_00 = bVar3.m_floats._8_8_;
    uVar5 = bVar3.m_floats._0_8_;
    bVar3 = btVector3::normalized(this);
    plVar1 = local_10;
    idraw_00 = bVar3.m_floats._0_8_;
    bVar3 = ::operator*(m->m_el,this->m_floats);
    local_124 = bVar3.m_floats._8_8_;
    local_12c = bVar3.m_floats._0_8_;
    bVar3 = operator+(m->m_el,this);
    local_114 = bVar3.m_floats._8_8_;
    local_11c = bVar3.m_floats._0_8_;
    local_140 = 1.0;
    local_144 = 0.0;
    local_148 = 0.0;
    btVector3::btVector3(&local_13c,&local_140,&local_144,&local_148);
    (**(code **)(*plVar1 + 0x20))(plVar1,&local_28,&local_11c,&local_13c);
    plVar1 = local_10;
    bVar3 = ::operator*(m->m_el,this->m_floats);
    local_160 = bVar3.m_floats._8_8_;
    local_168 = bVar3.m_floats._0_8_;
    bVar3 = operator+(m->m_el,this);
    local_150 = bVar3.m_floats._8_8_;
    local_158 = bVar3.m_floats._0_8_;
    local_17c = 0.0;
    local_180 = 1.0;
    local_184 = 0.0;
    btVector3::btVector3(&local_178,&local_17c,&local_180,&local_184);
    (**(code **)(*plVar1 + 0x20))(plVar1,&local_28,&local_158,&local_178);
    bVar3 = ::operator*(m->m_el,this->m_floats);
    local_19c = bVar3.m_floats._8_8_;
    local_1a4 = bVar3.m_floats._0_8_;
    bVar3 = operator+(m->m_el,this);
    local_18c = bVar3.m_floats._8_8_;
    local_194 = bVar3.m_floats._0_8_;
    local_1b8 = 0.0;
    btVector3::btVector3
              (&local_1b4,&local_1b8,(btScalar *)&stack0xfffffffffffffe44,
               (btScalar *)&stack0xfffffffffffffe40);
    (**(code **)(*local_10 + 0x20))(local_10,&local_28,&local_194,&local_1b4);
    iVar4 = 0;
    while (n = iVar4,
          iVar2 = btAlignedObjectArray<btVector3>::size
                            ((btAlignedObjectArray<btVector3> *)(local_8 + 0x260)), iVar4 < iVar2) {
      btAlignedObjectArray<btVector3>::operator[]
                ((btAlignedObjectArray<btVector3> *)(local_8 + 0x260),n);
      bVar3 = ::operator*(m,this);
      local_1dc = bVar3.m_floats._8_8_;
      local_1e4 = bVar3.m_floats._0_8_;
      bVar3 = operator+(m->m_el,this);
      local_1d4 = bVar3.m_floats._0_8_;
      local_1cc = bVar3.m_floats[2];
      local_1f8 = 1.0;
      local_1fc = 0.0;
      local_200 = 1.0;
      btVector3::btVector3(&local_1f4,&local_1f8,&local_1fc,&local_200);
      drawVertex(idraw_00,x_00,(btScalar)((ulong)uVar5 >> 0x20),in_stack_ffffffffffffff08);
      iVar4 = n + 1;
    }
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::DrawFrame(		btSoftBody* psb,
											 btIDebugDraw* idraw)
{
	if(psb->m_pose.m_bframe)
	{
		static const btScalar	ascl=10;
		static const btScalar	nscl=(btScalar)0.1;
		const btVector3			com=psb->m_pose.m_com;
		const btMatrix3x3		trs=psb->m_pose.m_rot*psb->m_pose.m_scl;
		const btVector3			Xaxis=(trs*btVector3(1,0,0)).normalized();
		const btVector3			Yaxis=(trs*btVector3(0,1,0)).normalized();
		const btVector3			Zaxis=(trs*btVector3(0,0,1)).normalized();
		idraw->drawLine(com,com+Xaxis*ascl,btVector3(1,0,0));
		idraw->drawLine(com,com+Yaxis*ascl,btVector3(0,1,0));
		idraw->drawLine(com,com+Zaxis*ascl,btVector3(0,0,1));
		for(int i=0;i<psb->m_pose.m_pos.size();++i)
		{
			const btVector3	x=com+trs*psb->m_pose.m_pos[i];
			drawVertex(idraw,x,nscl,btVector3(1,0,1));
		}
	}
}